

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O1

void __thiscall
TEST_DoublingFactorCounterTest_NineGates_TestShell::
~TEST_DoublingFactorCounterTest_NineGates_TestShell
          (TEST_DoublingFactorCounterTest_NineGates_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, NineGates)
{
	addTriplet(Tile::OneOfCharacters, false);
	h.add(Tile::TwoOfCharacters);
	h.add(Tile::ThreeOfCharacters);
	h.add(Tile::FourOfCharacters);
	h.add(Tile::FiveOfCharacters);
	h.add(Tile::SixOfCharacters);
	h.add(Tile::SevenOfCharacters);
	h.add(Tile::EightOfCharacters);
	addTriplet(Tile::NineOfCharacters, false);

	h.add(Tile::NineOfCharacters);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::NineGates));
	CHECK_EQUAL(100, r.doubling_factor);
}